

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  char *pcVar5;
  
  puVar4 = (undefined8 *)op.m_size;
  lVar1 = *(long *)(os + 8);
  pcVar5 = "\n";
  if ((ulong)(puVar4[1] + lVar1) < 0x28) {
    lVar1 = std::__cxx11::string::find((char)os,10);
    if (lVar1 == -1) {
      lVar2 = std::__cxx11::string::find((char)op.m_size,10);
      lVar1 = *(long *)(os + 8);
      pcVar5 = "\n";
      if (lVar2 == -1) {
        pcVar5 = " ";
      }
    }
    else {
      lVar1 = *(long *)(os + 8);
    }
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,*(char **)os,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,1);
  poVar3 = (ostream *)std::ostream::write((char *)poVar3,(long)lhs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)*puVar4,puVar4[1]);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }